

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall QHttpNetworkConnectionChannel::abort(QHttpNetworkConnectionChannel *this)

{
  QObject *object;
  SocketState SVar1;
  QAbstractSocket *this_00;
  QLocalSocket *this_01;
  
  if (*(QIODevice **)(this + 0x10) == (QIODevice *)0x0) {
    *(undefined4 *)(this + 0x20) = 0;
    this[0x58] = (QHttpNetworkConnectionChannel)0x0;
  }
  else {
    SVar1 = QSocketAbstraction::socketState(*(QIODevice **)(this + 0x10));
    *(uint *)(this + 0x20) = (uint)(SVar1 != UnconnectedState) << 4;
    object = *(QObject **)(this + 0x10);
    this[0x58] = (QHttpNetworkConnectionChannel)0x0;
    if (object != (QObject *)0x0) {
      this_00 = QtPrivate::qobject_cast_helper<QAbstractSocket*,QObject>(object);
      if (this_00 != (QAbstractSocket *)0x0) {
        QAbstractSocket::abort(this_00);
        return;
      }
      this_01 = QtPrivate::qobject_cast_helper<QLocalSocket*,QObject>(object);
      if (this_01 != (QLocalSocket *)0x0) {
        QLocalSocket::abort(this_01);
        return;
      }
    }
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::abort()
{
    if (!socket)
        state = QHttpNetworkConnectionChannel::IdleState;
    else if (QSocketAbstraction::socketState(socket) == QAbstractSocket::UnconnectedState)
        state = QHttpNetworkConnectionChannel::IdleState;
    else
        state = QHttpNetworkConnectionChannel::ClosingState;

    // pendingEncrypt must only be true in between connected and encrypted states
    pendingEncrypt = false;

    if (socket) {
        // socket can be 0 since the host lookup is done from qhttpnetworkconnection.cpp while
        // there is no socket yet.
        auto callAbort = [](auto *s) {
            s->abort();
        };
        QSocketAbstraction::visit(callAbort, socket);
    }
}